

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O2

wstring * utf8ToUtf16(wstring *__return_storage_ptr__,string *utf8Str)

{
  size_type sVar1;
  size_type sVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
  sVar1 = utf8Str->_M_string_length;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring utf8ToUtf16(const std::string& utf8Str)
{
	// We don't expect any really interesting utf8 characters
	// Try doing this cheaply
	std::wstring out;
	out.reserve(utf8Str.length());

	for (char c : utf8Str)
	{
		out += (static_cast<wchar_t>(c));
	}

	return out;
	/*
	std::wstring_convert<std::codecvt_utf8_utf16<wchar_t>> conv;
	return conv.from_bytes(utf8Str);
	*/
}